

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_int32 *
ma_dr_flac_open_file_and_read_pcm_frames_s32
          (char *filename,uint *channels,uint *sampleRate,ma_uint64 *totalPCMFrameCount,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_dr_flac *pmVar1;
  char *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  ma_allocation_callbacks *in_R8;
  ma_dr_flac *pFlac;
  ma_uint64 *in_stack_00004000;
  uint *in_stack_00004008;
  uint *in_stack_00004010;
  ma_dr_flac *in_stack_00004018;
  undefined8 local_8;
  
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = 0;
  }
  if (in_RCX != (char *)0x0) {
    in_RCX[0] = '\0';
    in_RCX[1] = '\0';
    in_RCX[2] = '\0';
    in_RCX[3] = '\0';
    in_RCX[4] = '\0';
    in_RCX[5] = '\0';
    in_RCX[6] = '\0';
    in_RCX[7] = '\0';
  }
  pmVar1 = ma_dr_flac_open_file(in_RCX,in_R8);
  if (pmVar1 == (ma_dr_flac *)0x0) {
    local_8 = (ma_int32 *)0x0;
  }
  else {
    local_8 = ma_dr_flac__full_read_and_close_s32
                        (in_stack_00004018,in_stack_00004010,in_stack_00004008,in_stack_00004000);
  }
  return local_8;
}

Assistant:

MA_API ma_int32* ma_dr_flac_open_file_and_read_pcm_frames_s32(const char* filename, unsigned int* channels, unsigned int* sampleRate, ma_uint64* totalPCMFrameCount, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    if (sampleRate) {
        *sampleRate = 0;
    }
    if (channels) {
        *channels = 0;
    }
    if (totalPCMFrameCount) {
        *totalPCMFrameCount = 0;
    }
    pFlac = ma_dr_flac_open_file(filename, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    return ma_dr_flac__full_read_and_close_s32(pFlac, channels, sampleRate, totalPCMFrameCount);
}